

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O1

bool __thiscall
Memory::PreReservedVirtualAllocWrapper::IsInRange
          (PreReservedVirtualAllocWrapper *this,void *address)

{
  void *pvVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  SIZE_T SVar7;
  undefined8 *in_FS_OFFSET;
  undefined1 local_50 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  
  pvVar1 = this->preReservedStartAddress;
  if (pvVar1 == (void *)0x0) {
    return false;
  }
  if (pvVar1 <= address) {
    uVar6 = AutoSystemInfo::GetAllocationGranularityPageCount(&AutoSystemInfo::Data);
    bVar4 = true;
    if (address < (void *)((long)pvVar1 + (ulong)(uVar6 << 0x18))) goto LAB_002af61a;
  }
  bVar4 = false;
LAB_002af61a:
  if (!bVar4) {
    return bVar4;
  }
  SVar7 = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)local_50,0x30);
  if (SVar7 == 0) {
    return false;
  }
  if ((int)memBasicInfo.RegionSize == 0x1000) {
    return bVar4;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  *puVar2 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                     ,0x97,"(memBasicInfo.State == 0x1000)",
                     "Memory not committed? Checking for uncommitted address region?");
  if (!bVar5) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar2 = 0;
  return bVar4;
}

Assistant:

bool
PreReservedVirtualAllocWrapper::IsInRange(void * address)
{
    if (!this->IsPreReservedRegionPresent())
    {
        return false;
    }
    bool isInRange = IsInRange(GetPreReservedStartAddress(), address);
#if DBG
    if (isInRange)
    {
        //Check if the region is in MEM_COMMIT state.
        MEMORY_BASIC_INFORMATION memBasicInfo;
        size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
        if (bytes == 0)
        {
            return false;
        }
        AssertMsg(memBasicInfo.State == MEM_COMMIT, "Memory not committed? Checking for uncommitted address region?");
    }
#endif
    return isInRange;
}